

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Izhikevich.cpp
# Opt level: O0

void __thiscall Izhikevich::Izhikevich(Izhikevich *this,long n_populationID,int n_neuronID)

{
  Neuron *pNVar1;
  Logging *this_00;
  int in_EDX;
  long in_RSI;
  Neuron *in_RDI;
  
  Neuron::Neuron(in_RDI);
  in_RDI->_vptr_Neuron = (_func_int **)&PTR_update_0012bad0;
  in_RDI[2]._vptr_Neuron = (_func_int **)0x0;
  in_RDI[2].populationID = 0;
  pNVar1 = in_RDI + 2;
  this_00 = (Logging *)operator_new(0x28);
  Izhikevich_param::Izhikevich_param((Izhikevich_param *)this_00);
  pNVar1->logger = this_00;
  in_RDI->populationID = in_RSI;
  in_RDI->neuronID = in_EDX;
  in_RDI[1].populationID =
       (long)((in_RDI[2].logger)->value_populationID).
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  in_RDI[1]._vptr_Neuron = (_func_int **)0x0;
  Neuron::initialize(in_RDI);
  return;
}

Assistant:

Izhikevich::Izhikevich(long n_populationID, int n_neuronID) : param(new Izhikevich_param) {
    populationID = n_populationID;
    neuronID = n_neuronID;
    v = param->c;
    u = 0.0;
    initialize();
}